

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O1

void __thiscall
vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
prepare_next_dimension
          (vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_> *this,
          int dimension)

{
  pointer piVar1;
  rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_> *prVar2;
  allocator_type local_2a;
  allocator_type local_29;
  
  prVar2 = this->comparator;
  if (prVar2 != (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                 *)0x0) {
    piVar1 = (prVar2->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1,(long)(prVar2->vertices).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1)
      ;
    }
    operator_delete(prVar2,0x30);
  }
  prVar2 = (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_> *)
           operator_new(0x30);
  prVar2->dist = this->distance_matrix;
  prVar2->dim = dimension;
  std::vector<int,_std::allocator<int>_>::vector(&prVar2->vertices,(long)(dimension + 1),&local_2a);
  prVar2->binomial_coeff = &this->binomial_coeff;
  this->comparator = prVar2;
  prVar2 = this->next_comparator;
  if (prVar2 != (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                 *)0x0) {
    piVar1 = (prVar2->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1,(long)(prVar2->vertices).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1)
      ;
    }
    operator_delete(prVar2,0x30);
  }
  prVar2 = (rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_> *)
           operator_new(0x30);
  prVar2->dist = this->distance_matrix;
  prVar2->dim = dimension + 1;
  std::vector<int,_std::allocator<int>_>::vector(&prVar2->vertices,(long)(dimension + 2),&local_29);
  prVar2->binomial_coeff = &this->binomial_coeff;
  this->next_comparator = prVar2;
  if (0 < dimension) {
    this->current_dimension = this->current_dimension + 1;
  }
  return;
}

Assistant:

void prepare_next_dimension(int dimension) {
		if (comparator != nullptr) delete comparator;
		comparator = new rips_filtration_comparator<DistanceMatrix>(distance_matrix, dimension, binomial_coeff);

		if (next_comparator != nullptr) delete next_comparator;
		next_comparator =
		    new rips_filtration_comparator<DistanceMatrix>(distance_matrix, dimension + 1, binomial_coeff);

		if (dimension > 0) current_dimension++;
	}